

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::PerformIntegerOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  Type *type;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  uint64_t uVar5;
  Constant *c;
  Instruction *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t val;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined4 extraout_var_00;
  
  iVar1 = (*input1->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("input1->type()->AsInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x25d,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar1 = (*input1->type_->_vptr_Type[10])();
  type = (Type *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*type->_vptr_Type[10])(type);
  iVar1 = *(int *)(CONCAT44(extraout_var_01,iVar1) + 0x24);
  if ((iVar1 != 0x20) && (iVar1 != 0x40)) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x260,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(opcode) {
  case OpIAdd:
    if (iVar1 != 0x40) {
      uVar3 = analysis::Constant::GetU32(input1);
      uVar2 = analysis::Constant::GetU32(input2);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2 + uVar3;
LAB_004beb10:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                 (value_type_conflict1 *)&local_48);
      goto LAB_004beb18;
    }
    uVar4 = analysis::Constant::GetU64(input1);
    uVar5 = analysis::Constant::GetU64(input2);
    uVar4 = uVar4 + uVar5;
    break;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x27e,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpISub:
    if (iVar1 != 0x40) {
      uVar3 = analysis::Constant::GetU32(input1);
      uVar2 = analysis::Constant::GetU32(input2);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar3 - uVar2;
      goto LAB_004beb10;
    }
    uVar4 = analysis::Constant::GetU64(input1);
    uVar5 = analysis::Constant::GetU64(input2);
    uVar4 = uVar4 - uVar5;
    break;
  case OpIMul:
    if (iVar1 != 0x40) {
      uVar3 = analysis::Constant::GetU32(input1);
      uVar2 = analysis::Constant::GetU32(input2);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2 * uVar3;
      goto LAB_004beb10;
    }
    uVar4 = analysis::Constant::GetU64(input1);
    uVar5 = analysis::Constant::GetU64(input2);
    uVar4 = uVar4 * uVar5;
    break;
  case OpUDiv:
  case OpSDiv:
    __assert_fail("false && \"Should not merge integer division\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x275,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  ExtractInts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,uVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
LAB_004beb18:
  c = analysis::ConstantManager::GetConstant
                (const_mgr,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
  this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
  uVar3 = Instruction::result_id(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return uVar3;
}

Assistant:

uint32_t PerformIntegerOperation(analysis::ConstantManager* const_mgr,
                                 spv::Op opcode,
                                 const analysis::Constant* input1,
                                 const analysis::Constant* input2) {
  assert(input1->type()->AsInteger());
  const analysis::Integer* type = input1->type()->AsInteger();
  uint32_t width = type->AsInteger()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  // Regardless of the sign of the constant, folding is performed on an unsigned
  // interpretation of the constant data. This avoids signed integer overflow
  // while folding, and works because sign is irrelevant for the IAdd, ISub and
  // IMul instructions.
#define FOLD_OP(op)                                      \
  if (width == 64) {                                     \
    uint64_t val = input1->GetU64() op input2->GetU64(); \
    words = ExtractInts(val);                            \
  } else {                                               \
    uint32_t val = input1->GetU32() op input2->GetU32(); \
    words.push_back(val);                                \
  }                                                      \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpIMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpSDiv:
    case spv::Op::OpUDiv:
      assert(false && "Should not merge integer division");
      break;
    case spv::Op::OpIAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpISub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}